

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

ostream * std::operator<<(ostream *ofs,StringData *v)

{
  string local_30;
  
  tinyusdz::buildEscapedAndQuotedStringForUSDA(&local_30,&v->value);
  std::operator<<(ofs,(string *)&local_30);
  std::__cxx11::string::_M_dispose();
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs,
                         const tinyusdz::value::StringData &v) {
#if 0
  std::string delim = v.single_quote ? "'" : "\"";

  if (v.is_triple_quoted) {
    if (v.single_quote) {
      if (tinyusdz::hasEscapedTripleQuotes(v.value, /* double quote */false)) {
        // Change to use """
        delim = "\"\"\"";
      } else {
        delim = "'''";
      }
    } else {
      delim = "\"\"\"";
    }
  }

  ofs << delim;
  ofs << tinyusdz::escapeBackslash(v.value, v.is_triple_quoted);
  ofs << delim;
#else
  ofs << tinyusdz::buildEscapedAndQuotedStringForUSDA(v.value);
#endif

  return ofs;
}